

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O1

bool __thiscall
wasm::SmallVector<wasm::Literal,_1UL>::operator==
          (SmallVector<wasm::Literal,_1UL> *this,SmallVector<wasm::Literal,_1UL> *other)

{
  char cVar1;
  Literal *pLVar2;
  Literal *pLVar3;
  ulong uVar4;
  Literal *pLVar5;
  bool bVar6;
  
  if (this->usedFixed != other->usedFixed) {
    return false;
  }
  bVar6 = this->usedFixed != 0;
  if (bVar6) {
    cVar1 = wasm::Literal::operator!=((this->fixed)._M_elems,(other->fixed)._M_elems);
    if (cVar1 == '\0') {
      uVar4 = 0;
      pLVar2 = (Literal *)&other->flexible;
      pLVar3 = (Literal *)&this->flexible;
      do {
        uVar4 = uVar4 + 1;
        bVar6 = uVar4 < this->usedFixed;
        if (!bVar6) goto LAB_00153773;
        cVar1 = wasm::Literal::operator!=(pLVar3,pLVar2);
        pLVar2 = pLVar2 + 1;
        pLVar3 = pLVar3 + 1;
      } while (cVar1 == '\0');
    }
    if (bVar6) {
      return false;
    }
  }
LAB_00153773:
  pLVar2 = (this->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar3 = (this->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar5 = (other->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((long)pLVar3 - (long)pLVar2 ==
      (long)(other->flexible).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)pLVar5) {
    if (pLVar2 == pLVar3) {
      return pLVar2 == pLVar3;
    }
    cVar1 = wasm::Literal::operator==(pLVar2,pLVar5);
    if (cVar1 != '\0') {
      do {
        pLVar2 = pLVar2 + 1;
        pLVar5 = pLVar5 + 1;
        if (pLVar2 == pLVar3) {
          return pLVar2 == pLVar3;
        }
        cVar1 = wasm::Literal::operator==(pLVar2,pLVar5);
      } while (cVar1 != '\0');
      return false;
    }
  }
  return false;
}

Assistant:

bool operator==(const SmallVector<T, N>& other) const {
    if (usedFixed != other.usedFixed) {
      return false;
    }
    for (size_t i = 0; i < usedFixed; i++) {
      if (fixed[i] != other.fixed[i]) {
        return false;
      }
    }
    return flexible == other.flexible;
  }